

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_id_getter.cpp
# Opt level: O0

void __thiscall SharedIdGetter::put(SharedIdGetter *this,uid_t id)

{
  unsigned_long uVar1;
  undefined4 uVar2;
  pointer pSVar3;
  unsigned_long *puVar4;
  pointer this_00;
  size_t sVar5;
  ContextManager *pCVar6;
  type this_01;
  uint *puVar7;
  string local_58;
  undefined1 local_28 [8];
  unique_lock<SharedMutex> lock;
  uid_t id_local;
  SharedIdGetter *this_local;
  
  lock._12_4_ = id;
  std::unique_lock<SharedMutex>::unique_lock((unique_lock<SharedMutex> *)local_28,&this->mutex_);
  pSVar3 = std::
           unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
           ::operator->(&this->stack_head_);
  puVar4 = SharedMemoryObject<unsigned_long>::get(pSVar3);
  uVar1 = *puVar4;
  this_00 = std::
            unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
            ::operator->(&this->ids_stack_);
  sVar5 = SharedMemoryArray<unsigned_int>::size(this_00);
  if (uVar1 == sVar5) {
    pCVar6 = ContextManager::get();
    format_abi_cxx11_(&local_58,"Failed to put ID (%d): stack is full",(ulong)(uint)lock._12_4_);
    (**pCVar6->_vptr_ContextManager)(pCVar6,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  uVar2 = lock._12_4_;
  this_01 = std::
            unique_ptr<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
            ::operator*(&this->ids_stack_);
  pSVar3 = std::
           unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
           ::operator->(&this->stack_head_);
  puVar4 = SharedMemoryObject<unsigned_long>::get(pSVar3);
  puVar7 = SharedMemoryArray<unsigned_int>::operator[](this_01,*puVar4);
  *puVar7 = uVar2;
  pSVar3 = std::
           unique_ptr<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
           ::operator->(&this->stack_head_);
  puVar4 = SharedMemoryObject<unsigned_long>::get(pSVar3);
  *puVar4 = *puVar4 + 1;
  std::unique_lock<SharedMutex>::~unique_lock((unique_lock<SharedMutex> *)local_28);
  return;
}

Assistant:

void SharedIdGetter::put(uid_t id) {
    std::unique_lock lock(mutex_);
    if (*stack_head_->get() == ids_stack_->size()) {
        die(format("Failed to put ID (%d): stack is full", id));
    }
    (*ids_stack_)[*stack_head_->get()] = id;
    (*stack_head_->get())++;
}